

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

archive_entry_linkresolver * archive_entry_linkresolver_new(void)

{
  links_entry **pplVar1;
  archive_entry_linkresolver *res;
  
  res = (archive_entry_linkresolver *)calloc(1,0x28);
  if (res == (archive_entry_linkresolver *)0x0) {
    res = (archive_entry_linkresolver *)0x0;
  }
  else {
    res->number_buckets = 0x400;
    pplVar1 = (links_entry **)calloc(res->number_buckets,8);
    res->buckets = pplVar1;
    if (res->buckets == (links_entry **)0x0) {
      free(res);
      res = (archive_entry_linkresolver *)0x0;
    }
  }
  return res;
}

Assistant:

struct archive_entry_linkresolver *
archive_entry_linkresolver_new(void)
{
	struct archive_entry_linkresolver *res;

	/* Check for positive power-of-two */
	if (links_cache_initial_size == 0 ||
	    (links_cache_initial_size & (links_cache_initial_size - 1)) != 0)
		return (NULL);

	res = calloc(1, sizeof(struct archive_entry_linkresolver));
	if (res == NULL)
		return (NULL);
	res->number_buckets = links_cache_initial_size;
	res->buckets = calloc(res->number_buckets, sizeof(res->buckets[0]));
	if (res->buckets == NULL) {
		free(res);
		return (NULL);
	}
	return (res);
}